

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_dictionary_utils.cpp
# Opt level: O0

void bidfx_public_api::price::pixie::DataDictionaryUtils::AddAllFields
               (IDataDictionary *data_dictionary,
               vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
               *field_defs)

{
  bool bVar1;
  FieldDef local_68;
  reference local_38;
  FieldDef *curr_field_def;
  iterator __end2;
  iterator __begin2;
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  *__range2;
  vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
  *field_defs_local;
  IDataDictionary *data_dictionary_local;
  
  __end2 = std::
           vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
           ::begin(field_defs);
  curr_field_def =
       (FieldDef *)
       std::
       vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>
       ::end(field_defs);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end2,(__normal_iterator<bidfx_public_api::price::pixie::FieldDef_*,_std::vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>_>
                                *)&curr_field_def);
    if (!bVar1) break;
    local_38 = __gnu_cxx::
               __normal_iterator<bidfx_public_api::price::pixie::FieldDef_*,_std::vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>_>
               ::operator*(&__end2);
    FieldDef::FieldDef(&local_68,local_38);
    (*data_dictionary->_vptr_IDataDictionary[2])(data_dictionary,&local_68);
    FieldDef::~FieldDef(&local_68);
    __gnu_cxx::
    __normal_iterator<bidfx_public_api::price::pixie::FieldDef_*,_std::vector<bidfx_public_api::price::pixie::FieldDef,_std::allocator<bidfx_public_api::price::pixie::FieldDef>_>_>
    ::operator++(&__end2);
  }
  return;
}

Assistant:

void DataDictionaryUtils::AddAllFields(IDataDictionary& data_dictionary,
                                       std::vector<FieldDef>& field_defs)
{
    for (const auto& curr_field_def : field_defs)
    {
        data_dictionary.AddFieldDef(curr_field_def);
    }
}